

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

void Eigen::internal::
     set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                *begin,__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                       *end,SparseMatrix<double,_0,_int> *mat,int Options)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Triplet<double,_int> *pTVar6;
  undefined4 uVar7;
  ulong uVar8;
  Triplet<double,_int> *pTVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  undefined1 local_98 [8];
  SparseMatrix<double,_1,_int> trMat;
  Matrix<int,__1,_1,_0,__1,_1> local_40;
  
  local_98[0] = false;
  local_98._4_4_ = 0;
  trMat._0_4_ = 0;
  trMat.m_innerSize = 0;
  trMat._12_4_ = 0;
  trMat.m_outerIndex = (Index *)0x0;
  trMat.m_innerNonZeros = (Index *)0x0;
  trMat.m_data.m_values = (Scalar_conflict *)0x0;
  trMat.m_data.m_indices = (Index *)0x0;
  trMat.m_data.m_size = 0;
  SparseMatrix<double,_1,_int>::resize
            ((SparseMatrix<double,_1,_int> *)local_98,mat->m_innerSize,mat->m_outerSize);
  pTVar9 = begin->_M_current;
  pTVar6 = end->_M_current;
  if (pTVar9 != pTVar6) {
    uVar7 = local_98._4_4_;
    lVar12 = (long)(int)local_98._4_4_;
    trMat.m_data.m_allocatedSize = (size_t)end;
    if (lVar12 == 0) {
      local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (int *)0x0;
      uVar8 = 0;
    }
    else {
      if (((int)local_98._4_4_ < 0) ||
         (local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (int *)malloc(lVar12 * 4),
         local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
         (int *)0x0)) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = std::streambuf::xsgetn;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      uVar8 = (ulong)(uVar7 & 0x7ffffffc);
      if (3 < (uint)uVar7) {
        uVar11 = 0;
        do {
          piVar1 = local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data + uVar11;
          piVar1[0] = 0;
          piVar1[1] = 0;
          piVar1[2] = 0;
          piVar1[3] = 0;
          uVar11 = uVar11 + 4;
        } while (uVar11 < uVar8);
      }
    }
    piVar1 = local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar12;
    if ((long)uVar8 < lVar12) {
      memset(local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             (ulong)((uint)uVar7 >> 2) * 4,0,lVar12 * 4 + (ulong)((uint)uVar7 >> 2) * -0x10);
    }
    iVar3 = mat->m_outerSize;
    iVar4 = mat->m_innerSize;
    do {
      iVar5 = pTVar9->m_row;
      if (((((long)iVar5 < 0) || (iVar4 <= iVar5)) || (pTVar9->m_col < 0)) ||
         (iVar3 <= pTVar9->m_col)) {
        __assert_fail("it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x3b8,
                      "void Eigen::internal::set_from_triplets(const InputIterator &, const InputIterator &, SparseMatrixType &, int) [InputIterator = __gnu_cxx::__normal_iterator<Eigen::Triplet<double> *, std::vector<Eigen::Triplet<double>>>, SparseMatrixType = Eigen::SparseMatrix<double>]"
                     );
      }
      if ((int)uVar7 <= iVar5) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                     );
      }
      piVar1[iVar5] = piVar1[iVar5] + 1;
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 != pTVar6);
    SparseMatrix<double,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
              ((SparseMatrix<double,1,int> *)local_98,&local_40);
    pTVar9 = begin->_M_current;
    pTVar6 = *(Triplet<double,_int> **)trMat.m_data.m_allocatedSize;
    if (pTVar6 != pTVar9) {
      if (trMat.m_outerIndex == (Index *)0x0) {
        __assert_fail("!isCompressed()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x34a,
                      "Scalar &Eigen::SparseMatrix<double, 1>::insertBackUncompressed(Index, Index) [_Scalar = double, _Flags = 1, _Index = int]"
                     );
      }
      do {
        lVar12 = (long)pTVar9->m_row;
        iVar3 = trMat.m_outerIndex[lVar12];
        iVar4 = *(int *)(trMat._8_8_ + lVar12 * 4);
        if (*(int *)(trMat._8_8_ + 4 + lVar12 * 4) - iVar4 < iVar3) {
          __assert_fail("m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                        ,0x34b,
                        "Scalar &Eigen::SparseMatrix<double, 1>::insertBackUncompressed(Index, Index) [_Scalar = double, _Flags = 1, _Index = int]"
                       );
        }
        iVar5 = pTVar9->m_col;
        dVar2 = pTVar9->m_value;
        trMat.m_outerIndex[lVar12] = iVar3 + 1;
        lVar12 = (long)(iVar4 + iVar3);
        *(int *)((long)trMat.m_data.m_values + lVar12 * 4) = iVar5;
        *(double *)(trMat.m_innerNonZeros + lVar12 * 2) = dVar2;
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar6);
    }
    SparseMatrix<double,_1,_int>::sumupDuplicates((SparseMatrix<double,_1,_int> *)local_98);
    free(local_40.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)mat,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *)local_98);
  free((void *)trMat._8_8_);
  free(trMat.m_outerIndex);
  CompressedStorage<double,_int>::~CompressedStorage
            ((CompressedStorage<double,_int> *)&trMat.m_innerNonZeros);
  return;
}

Assistant:

void set_from_triplets(const InputIterator& begin, const InputIterator& end, SparseMatrixType& mat, int Options = 0)
{
  EIGEN_UNUSED_VARIABLE(Options);
  enum { IsRowMajor = SparseMatrixType::IsRowMajor };
  typedef typename SparseMatrixType::Scalar Scalar;
  typedef typename SparseMatrixType::Index Index;
  SparseMatrix<Scalar,IsRowMajor?ColMajor:RowMajor,Index> trMat(mat.rows(),mat.cols());

  if(begin!=end)
  {
    // pass 1: count the nnz per inner-vector
    Matrix<Index,Dynamic,1> wi(trMat.outerSize());
    wi.setZero();
    for(InputIterator it(begin); it!=end; ++it)
    {
      eigen_assert(it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols());
      wi(IsRowMajor ? it->col() : it->row())++;
    }

    // pass 2: insert all the elements into trMat
    trMat.reserve(wi);
    for(InputIterator it(begin); it!=end; ++it)
      trMat.insertBackUncompressed(it->row(),it->col()) = it->value();

    // pass 3:
    trMat.sumupDuplicates();
  }

  // pass 4: transposed copy -> implicit sorting
  mat = trMat;
}